

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1.c
# Opt level: O2

_Bool ssh1_connection_filter_queue(ssh1_connection_state *s)

{
  uint uVar1;
  PktInQueue *pPVar2;
  Ssh *ssh;
  _Bool _Var3;
  PktIn *pktin;
  unsigned_long uVar4;
  ssh1_channel *c;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  BinarySource *src;
  PacketProtocolLayer *ppl;
  ptrlen pVar8;
  uint localid;
  PacketProtocolLayer *local_38;
  
  local_38 = &s->ppl;
  ppl = local_38;
  do {
    while( true ) {
      _Var3 = ssh1_common_filter_queue(ppl);
      if (_Var3) {
        return true;
      }
      pPVar2 = (s->ppl).in_pq;
      pktin = (*pPVar2->after)(&pPVar2->pqb,(PacketQueueNode *)pPVar2,false);
      if (pktin == (PktIn *)0x0) {
        return false;
      }
      if (pktin->type - 0x15U < 5) break;
      _Var3 = ssh1_handle_direction_specific_packet(s,pktin);
      if (!_Var3) {
        return false;
      }
      pPVar2 = (s->ppl).in_pq;
      (*pPVar2->after)(&pPVar2->pqb,(PacketQueueNode *)pPVar2,true);
      _Var3 = ssh1_check_termination(s);
      if (_Var3) {
        return true;
      }
    }
    src = pktin->binarysource_;
    uVar4 = BinarySource_get_uint32(src);
    localid = (uint)uVar4;
    c = (ssh1_channel *)find234(s->channels,&localid,ssh1_channelfind);
    if (c == (ssh1_channel *)0x0) {
LAB_0011f666:
      ssh = (s->ppl).ssh;
      pcVar6 = ssh1_pkt_type(pktin->type);
      if (c == (ssh1_channel *)0x0) {
        pcVar7 = "nonexistent";
      }
      else {
        pcVar7 = "open";
        if (c->halfopen != false) {
          pcVar7 = "half-open";
        }
      }
      ssh_remote_error(ssh,"Received %s for %s channel %u",pcVar6,pcVar7,(ulong)localid);
      return true;
    }
    uVar1 = pktin->type - 0x15;
    _Var3 = c->halfopen;
    if (_Var3 != uVar1 < 2) goto LAB_0011f666;
    switch(uVar1) {
    case 0:
      if (_Var3 == false) {
        __assert_fail("c->halfopen",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/connection1.c"
                      ,0x101,"_Bool ssh1_connection_filter_queue(struct ssh1_connection_state *)");
      }
      uVar4 = BinarySource_get_uint32(src);
      c->remoteid = (uint)uVar4;
      c->halfopen = false;
      c->throttling_conn = false;
      (*c->chan->vt->open_confirmation)(c->chan);
      ssh1_channel_check_close(c);
      if (c->pending_eof == true) {
        ssh1_channel_try_eof(c);
      }
      break;
    case 1:
      if (_Var3 == false) {
        __assert_fail("c->halfopen",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/connection1.c"
                      ,0x11e,"_Bool ssh1_connection_filter_queue(struct ssh1_connection_state *)");
      }
      (*c->chan->vt->open_failed)(c->chan,(char *)0x0);
      (*c->chan->vt->free)(c->chan);
      del234(s->channels,c);
      ssh1_channel_free(c);
      break;
    case 2:
      pVar8 = BinarySource_get_string(src);
      if (((pktin->binarysource_[0].err == BSE_NO_ERROR) &&
          (sVar5 = (*c->chan->vt->send)(c->chan,false,pVar8.ptr,pVar8.len),
          c->throttling_conn == false)) && (0x8000 < (int)sVar5)) {
        c->throttling_conn = true;
        ssh_throttle_conn((s->ppl).ssh,1);
      }
      break;
    case 3:
      if ((c->closes & 4U) == 0) {
        c->closes = c->closes | 4;
        (*c->chan->vt->send_eof)(c->chan);
LAB_0011f60c:
        ssh1_channel_check_close(c);
      }
      break;
    case 4:
      uVar1 = c->closes;
      if ((uVar1 & 8) == 0) {
        if ((uVar1 & 1) == 0) {
          ssh_remote_error((s->ppl).ssh,
                           "Received CHANNEL_CLOSE_CONFIRMATION for channel %u for which we never sent CHANNEL_CLOSE\n"
                           ,(ulong)c->localid);
          return true;
        }
        c->closes = uVar1 | 8;
        goto LAB_0011f60c;
      }
    }
    pPVar2 = (s->ppl).in_pq;
    (*pPVar2->after)(&pPVar2->pqb,(PacketQueueNode *)pPVar2,true);
    ppl = local_38;
  } while( true );
}

Assistant:

static bool ssh1_connection_filter_queue(struct ssh1_connection_state *s)
{
    PktIn *pktin;
    ptrlen data;
    struct ssh1_channel *c;
    unsigned localid;
    bool expect_halfopen;

    while (1) {
        if (ssh1_common_filter_queue(&s->ppl))
            return true;
        if ((pktin = pq_peek(s->ppl.in_pq)) == NULL)
            return false;

        switch (pktin->type) {
          case SSH1_MSG_CHANNEL_DATA:
          case SSH1_MSG_CHANNEL_OPEN_CONFIRMATION:
          case SSH1_MSG_CHANNEL_OPEN_FAILURE:
          case SSH1_MSG_CHANNEL_CLOSE:
          case SSH1_MSG_CHANNEL_CLOSE_CONFIRMATION:
            /*
             * Common preliminary code for all the messages from the
             * server that cite one of our channel ids: look up that
             * channel id, check it exists, and if it's for a sharing
             * downstream, pass it on.
             */
            localid = get_uint32(pktin);
            c = find234(s->channels, &localid, ssh1_channelfind);

            expect_halfopen = (
                pktin->type == SSH1_MSG_CHANNEL_OPEN_CONFIRMATION ||
                pktin->type == SSH1_MSG_CHANNEL_OPEN_FAILURE);

            if (!c || c->halfopen != expect_halfopen) {
                ssh_remote_error(
                    s->ppl.ssh, "Received %s for %s channel %u",
                    ssh1_pkt_type(pktin->type),
                    !c ? "nonexistent" : c->halfopen ? "half-open" : "open",
                    localid);
                return true;
            }

            switch (pktin->type) {
              case SSH1_MSG_CHANNEL_OPEN_CONFIRMATION:
                assert(c->halfopen);
                c->remoteid = get_uint32(pktin);
                c->halfopen = false;
                c->throttling_conn = false;

                chan_open_confirmation(c->chan);

                /*
                 * Now that the channel is fully open, it's possible
                 * in principle to immediately close it. Check whether
                 * it wants us to!
                 *
                 * This can occur if a local socket error occurred
                 * between us sending out CHANNEL_OPEN and receiving
                 * OPEN_CONFIRMATION. If that happens, all we can do
                 * is immediately initiate close proceedings now that
                 * we know the server's id to put in the close
                 * message. We'll have handled that in this code by
                 * having already turned c->chan into a zombie, so its
                 * want_close method (which ssh1_channel_check_close
                 * will consult) will already be returning true.
                 */
                ssh1_channel_check_close(c);

                if (c->pending_eof)
                    ssh1_channel_try_eof(c); /* in case we had a pending EOF */
                break;

              case SSH1_MSG_CHANNEL_OPEN_FAILURE:
                assert(c->halfopen);

                chan_open_failed(c->chan, NULL);
                chan_free(c->chan);

                del234(s->channels, c);
                ssh1_channel_free(c);
                break;

              case SSH1_MSG_CHANNEL_DATA:
                data = get_string(pktin);
                if (!get_err(pktin)) {
                    int bufsize = chan_send(
                        c->chan, false, data.ptr, data.len);

                    if (!c->throttling_conn && bufsize > SSH1_BUFFER_LIMIT) {
                        c->throttling_conn = true;
                        ssh_throttle_conn(s->ppl.ssh, +1);
                    }
                }
                break;

              case SSH1_MSG_CHANNEL_CLOSE:
                if (!(c->closes & CLOSES_RCVD_CLOSE)) {
                    c->closes |= CLOSES_RCVD_CLOSE;
                    chan_send_eof(c->chan);
                    ssh1_channel_check_close(c);
                }
                break;

              case SSH1_MSG_CHANNEL_CLOSE_CONFIRMATION:
                if (!(c->closes & CLOSES_RCVD_CLOSECONF)) {
                    if (!(c->closes & CLOSES_SENT_CLOSE)) {
                        ssh_remote_error(
                            s->ppl.ssh,
                            "Received CHANNEL_CLOSE_CONFIRMATION for channel"
                            " %u for which we never sent CHANNEL_CLOSE\n",
                            c->localid);
                        return true;
                    }

                    c->closes |= CLOSES_RCVD_CLOSECONF;
                    ssh1_channel_check_close(c);
                }
                break;
            }

            pq_pop(s->ppl.in_pq);
            break;

          default:
            if (ssh1_handle_direction_specific_packet(s, pktin)) {
                pq_pop(s->ppl.in_pq);
                if (ssh1_check_termination(s))
                    return true;
            } else {
                return false;
            }
        }
    }
}